

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommonTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmCommonTargetGenerator::AppendFortranFormatFlags
          (cmCommonTargetGenerator *this,string *flags,cmSourceFile *source)

{
  cmGeneratorTarget *this_00;
  cmMakefile *this_01;
  cmLocalCommonGenerator *pcVar1;
  FortranFormat FVar2;
  string *psVar3;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *__s;
  string_view value;
  string_view value_00;
  string srcfmt;
  allocator<char> local_59;
  string local_58;
  size_t local_38;
  cmOutputConverter *local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"Fortran_FORMAT",&local_59)
  ;
  psVar3 = cmSourceFile::GetSafeProperty(source,&local_58);
  std::__cxx11::string::string((string *)&local_38,(string *)psVar3);
  std::__cxx11::string::~string((string *)&local_58);
  value._M_str = extraout_RDX;
  value._M_len = local_38;
  FVar2 = cmOutputConverter::GetFortranFormat(local_30,value);
  if (FVar2 == FortranFormatNone) {
    this_00 = this->GeneratorTarget;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"Fortran_FORMAT",&local_59);
    psVar3 = cmGeneratorTarget::GetSafeProperty(this_00,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    value_00._M_str = extraout_RDX_00;
    value_00._M_len = (size_t)(psVar3->_M_dataplus)._M_p;
    FVar2 = cmOutputConverter::GetFortranFormat
                      ((cmOutputConverter *)psVar3->_M_string_length,value_00);
  }
  if (FVar2 == FortranFormatFixed) {
    __s = "CMAKE_Fortran_FORMAT_FIXED_FLAG";
  }
  else {
    if (FVar2 != FortranFormatFree) goto LAB_003b0636;
    __s = "CMAKE_Fortran_FORMAT_FREE_FLAG";
  }
  this_01 = this->Makefile;
  pcVar1 = this->LocalCommonGenerator;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,__s,&local_59);
  psVar3 = cmMakefile::GetSafeDefinition(this_01,&local_58);
  (*(pcVar1->super_cmLocalGenerator).super_cmOutputConverter._vptr_cmOutputConverter[7])
            (pcVar1,flags,psVar3);
  std::__cxx11::string::~string((string *)&local_58);
LAB_003b0636:
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void cmCommonTargetGenerator::AppendFortranFormatFlags(
  std::string& flags, cmSourceFile const& source)
{
  const std::string srcfmt = source.GetSafeProperty("Fortran_FORMAT");
  cmOutputConverter::FortranFormat format =
    cmOutputConverter::GetFortranFormat(srcfmt);
  if (format == cmOutputConverter::FortranFormatNone) {
    std::string const& tgtfmt =
      this->GeneratorTarget->GetSafeProperty("Fortran_FORMAT");
    format = cmOutputConverter::GetFortranFormat(tgtfmt);
  }
  const char* var = nullptr;
  switch (format) {
    case cmOutputConverter::FortranFormatFixed:
      var = "CMAKE_Fortran_FORMAT_FIXED_FLAG";
      break;
    case cmOutputConverter::FortranFormatFree:
      var = "CMAKE_Fortran_FORMAT_FREE_FLAG";
      break;
    default:
      break;
  }
  if (var) {
    this->LocalCommonGenerator->AppendFlags(
      flags, this->Makefile->GetSafeDefinition(var));
  }
}